

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O2

void __thiscall
Iir::HighPassTransform::HighPassTransform
          (HighPassTransform *this,double fc,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  uint pairIndex;
  PoleZeroPair *pPVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar3;
  uint pairIndex_00;
  uint uVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t cVar8;
  complex_t local_50;
  complex_t local_40;
  
  this->f = 0.0;
  if (0.5 <= fc) {
    throw_invalid_argument("The cutoff frequency needs to be below the Nyquist frequency.");
  }
  if (fc < 0.0) {
    throw_invalid_argument("Cutoff frequency is negative.");
  }
  digital->m_numPoles = 0;
  dVar5 = tan(fc * 3.141592653589793);
  this->f = 1.0 / dVar5;
  uVar1 = analog->m_numPoles;
  pairIndex = (int)uVar1 / 2;
  pairIndex_00 = 0;
  uVar4 = pairIndex;
  if ((int)pairIndex < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != pairIndex_00; pairIndex_00 = pairIndex_00 + 1) {
    uVar3 = (ulong)pairIndex_00;
    pPVar2 = LayoutBase::getPair(analog,pairIndex_00);
    uVar6 = *(undefined8 *)((pPVar2->poles).super_complex_pair_t.first._M_value + 8);
    c._M_value._8_8_ = extraout_RDX;
    c._M_value._0_8_ = uVar3;
    cVar8 = transform(this,c);
    c_00._M_value._8_8_ = cVar8._M_value._8_8_;
    uVar7 = *(undefined8 *)((pPVar2->zeros).super_complex_pair_t.first._M_value + 8);
    c_00._M_value._0_8_ = uVar3;
    local_40._M_value._8_8_ = uVar6;
    transform(this,c_00);
    local_50._M_value._8_8_ = uVar7;
    LayoutBase::addPoleZeroConjugatePairs(digital,&local_40,&local_50);
  }
  if ((uVar1 & 1) != 0) {
    uVar3 = (ulong)pairIndex;
    pPVar2 = LayoutBase::getPair(analog,pairIndex);
    uVar6 = *(undefined8 *)((pPVar2->poles).super_complex_pair_t.first._M_value + 8);
    cVar8._M_value._8_8_ = extraout_RDX_00;
    cVar8._M_value._0_8_ = uVar3;
    cVar8 = transform(this,cVar8);
    c_01._M_value._8_8_ = cVar8._M_value._8_8_;
    uVar7 = *(undefined8 *)((pPVar2->zeros).super_complex_pair_t.first._M_value + 8);
    c_01._M_value._0_8_ = uVar3;
    local_40._M_value._8_8_ = uVar6;
    transform(this,c_01);
    local_50._M_value._8_8_ = uVar7;
    LayoutBase::add(digital,&local_40,&local_50);
  }
  dVar5 = analog->m_normalGain;
  digital->m_normalW = 3.141592653589793 - analog->m_normalW;
  digital->m_normalGain = dVar5;
  return;
}

Assistant:

HighPassTransform::HighPassTransform (double fc,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);
	
	digital.reset ();
	
	// prewarp
	f = 1. / tan (doublePi * fc);
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		digital.addPoleZeroConjugatePairs (transform (pair.poles.first),
						   transform (pair.zeros.first));
	}
	
	if (numPoles & 1)
	{
		const PoleZeroPair& pair = analog[pairs];
		digital.add (transform (pair.poles.first),
			     transform (pair.zeros.first));
	}
	
	digital.setNormal (doublePi - analog.getNormalW(),
			   analog.getNormalGain());
}